

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float *pfVar3;
  float *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R9D;
  bool bVar4;
  float in_XMM0_Da;
  float linear_zero_pos_00;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  float in_XMM1_Da;
  float in_XMM2_Da;
  undefined8 *in_stack_00000008;
  float grab_pos;
  float grab_t;
  float v_new_off_round;
  float v_new_off_floor;
  float v_new_off_f;
  float a_1;
  float a;
  float v_new;
  int decimal_precision;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  float linear_dist_max_to_0;
  float linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  size_t in_stack_fffffffffffffef8;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float local_e8;
  undefined3 in_stack_ffffffffffffff20;
  uint3 uVar12;
  uint uVar13;
  undefined1 uVar14;
  float in_stack_ffffffffffffff24;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  ImGuiInputReadMode in_stack_ffffffffffffff38;
  ImGuiNavDirSourceFlags in_stack_ffffffffffffff3c;
  undefined4 uStack_c0;
  float local_b8;
  float local_b4;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float local_88;
  float local_84;
  float fStack_80;
  float local_78;
  bool local_71;
  float local_68;
  float local_54;
  float power_00;
  
  pIVar1 = GImGui;
  bVar4 = (in_R9D & 1) != 0;
  uVar13 = CONCAT13(1,in_stack_ffffffffffffff20);
  if (in_EDX != 8) {
    uVar13 = CONCAT13(in_EDX == 9,in_stack_ffffffffffffff20);
  }
  uVar14 = (undefined1)(uVar13 >> 0x18);
  uVar12 = (uint3)(ushort)uVar13;
  if ((in_XMM2_Da != 1.0) || (NAN(in_XMM2_Da))) {
    uVar12 = CONCAT12(uVar14,(ushort)uVar13);
  }
  power_00 = (float)CONCAT13(uVar14,uVar12);
  linear_zero_pos_00 =
       ImVec2::operator[]((ImVec2 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffef8);
  fVar5 = ImVec2::operator[]((ImVec2 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                             ,in_stack_fffffffffffffef8);
  fVar5 = (linear_zero_pos_00 - fVar5) - 4.0;
  local_54 = (pIVar1->Style).GrabMinSize;
  if (in_XMM1_Da <= in_XMM0_Da) {
    local_e8 = in_XMM0_Da - in_XMM1_Da;
  }
  else {
    local_e8 = in_XMM1_Da - in_XMM0_Da;
  }
  local_84 = in_stack_ffffffffffffff08;
  if (((uVar13 & 0x1000000) == 0) && (0.0 <= local_e8)) {
    local_54 = ImMax<float>(fVar5 / (local_e8 + 1.0),(pIVar1->Style).GrabMinSize);
    local_84 = in_stack_ffffffffffffff08;
  }
  fVar6 = ImMin<float>(local_54,fVar5);
  fVar7 = ImVec2::operator[]((ImVec2 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                             ,in_stack_fffffffffffffef8);
  fVar7 = fVar6 * 0.5 + fVar7 + 2.0;
  fVar8 = ImVec2::operator[]((ImVec2 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                             ,in_stack_fffffffffffffef8);
  if (((uVar12 & 0x10000) == 0) || (0.0 <= in_XMM0_Da * in_XMM1_Da)) {
    local_68 = (float)(-(uint)(in_XMM0_Da < 0.0) & 0x3f800000);
  }
  else {
    in_stack_ffffffffffffff14 = in_XMM0_Da;
    if (in_XMM0_Da < 0.0) {
      in_stack_ffffffffffffff14 = -in_XMM0_Da;
    }
    local_68 = ImPow(0.0,2.81234e-39);
    in_stack_ffffffffffffff10 = in_XMM1_Da;
    if (in_XMM1_Da < 0.0) {
      in_stack_ffffffffffffff10 = -in_XMM1_Da;
    }
    fVar9 = ImPow(0.0,2.812479e-39);
    local_68 = local_68 / (local_68 + fVar9);
  }
  local_71 = false;
  if (pIVar1->ActiveId == in_ESI) {
    bVar2 = false;
    local_78 = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar3 = ImVec2::operator[]((ImVec2 *)
                                    CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                    in_stack_fffffffffffffef8);
        if (fVar5 - fVar6 <= 0.0) {
          in_stack_ffffffffffffff0c = 0.0;
        }
        else {
          in_stack_ffffffffffffff0c = ImClamp<float>((*pfVar3 - fVar7) / (fVar5 - fVar6),0.0,1.0);
        }
        local_78 = in_stack_ffffffffffffff0c;
        if (bVar4) {
          local_78 = 1.0 - in_stack_ffffffffffffff0c;
        }
        bVar2 = true;
      }
    }
    else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar11 = GetNavInputAmount2d(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                                   in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
      if (bVar4) {
        fStack_80 = IVar11.y;
        local_84 = -fStack_80;
      }
      else {
        local_84 = IVar11.x;
      }
      if ((pIVar1->NavActivatePressedId == in_ESI) && ((pIVar1->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((local_84 != 0.0) || (NAN(local_84))) {
        fVar9 = local_84;
        local_78 = SliderCalcRatioFromValueT<float,float>
                             ((ImGuiDataType)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                              in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,power_00,
                              linear_zero_pos_00);
        if ((uVar13 & 0x1000000) == 0) {
          in_stack_ffffffffffffff04 = 0.0;
        }
        else {
          in_stack_ffffffffffffff04 =
               (float)ImParseFormatPrecision
                                ((char *)CONCAT44(in_stack_ffffffffffffff0c,fVar9),
                                 (int)in_stack_ffffffffffffff04);
        }
        if (((int)in_stack_ffffffffffffff04 < 1) && ((uVar12 & 0x10000) == 0)) {
          if (((-100.0 <= local_e8) && (local_e8 <= 100.0)) || (bVar2 = IsNavInputDown(0xe), bVar2))
          {
            local_88 = (float)(~-(uint)(local_84 < 0.0) & 0x3f800000 |
                              -(uint)(local_84 < 0.0) & 0xbf800000) / local_e8;
          }
          else {
            local_88 = local_84 / 100.0;
          }
        }
        else {
          local_88 = local_84 / 100.0;
          bVar2 = IsNavInputDown(0xe);
          if (bVar2) {
            local_88 = local_88 / 10.0;
          }
        }
        bVar2 = IsNavInputDown(0xf);
        if (bVar2) {
          local_88 = local_88 * 10.0;
        }
        bVar2 = true;
        if (((1.0 <= local_78) && (0.0 < local_88)) || ((local_78 <= 0.0 && (local_88 < 0.0)))) {
          bVar2 = false;
          local_84 = fVar9;
        }
        else {
          local_78 = ImSaturate(local_78 + local_88);
          local_84 = fVar9;
        }
      }
    }
    if (bVar2) {
      if ((uVar12 & 0x10000) == 0) {
        if ((uVar13 & 0x1000000) == 0) {
          in_stack_ffffffffffffff5c = (in_XMM1_Da - in_XMM0_Da) * local_78 + 0.5;
        }
        else {
          ImLerp<float>(in_XMM0_Da,in_XMM1_Da,local_78);
        }
      }
      else if (local_68 <= local_78) {
        fVar9 = ImPow(0.0,2.814449e-39);
        fVar10 = ImMax<float>(in_XMM0_Da,0.0);
        ImLerp<float>(fVar10,in_XMM1_Da,fVar9);
      }
      else {
        fVar9 = ImPow(0.0,2.814195e-39);
        fVar10 = ImMin<float>(in_XMM1_Da,0.0);
        ImLerp<float>(fVar10,in_XMM0_Da,fVar9);
      }
      fVar9 = RoundScalarWithFormatT<float,float>
                        ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         (ImGuiDataType)in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      if ((*in_RCX != fVar9) || (NAN(*in_RCX) || NAN(fVar9))) {
        *in_RCX = fVar9;
        local_71 = true;
      }
    }
  }
  if (1.0 <= fVar5) {
    local_b8 = SliderCalcRatioFromValueT<float,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                          in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,power_00,
                          linear_zero_pos_00);
    if (bVar4) {
      local_b8 = 1.0 - local_b8;
    }
    ImLerp<float>(fVar7,-fVar6 * 0.5 + (fVar8 - 2.0),local_b8);
    if (bVar4) {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff0c,local_84,in_stack_ffffffffffffff04,
                     in_stack_ffffffffffffff00);
      *in_stack_00000008 = CONCAT44(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      in_stack_00000008[1] = CONCAT44(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff0c,local_84,in_stack_ffffffffffffff04,
                     in_stack_ffffffffffffff00);
      *in_stack_00000008 = CONCAT44(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      in_stack_00000008[1] = CONCAT44(uStack_c0,in_stack_ffffffffffffff3c);
    }
  }
  else {
    ImRect::ImRect((ImRect *)&local_b4,in_RDI,in_RDI);
    *in_stack_00000008 = CONCAT44(in_stack_ffffffffffffff50,local_b4);
    in_stack_00000008[1] = CONCAT44(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
  }
  return local_71;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}